

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

uint8_t cfd::core::SetPsbtOutput
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *value,
                  wally_psbt_output *output)

{
  uchar uVar1;
  pointer puVar2;
  pointer puVar3;
  CfdException *pCVar4;
  long lVar5;
  ulong uVar6;
  int ret;
  undefined1 local_c8 [39];
  allocator local_a1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Pubkey pk;
  
  puVar2 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  uVar1 = *puVar2;
  if (uVar1 == '\x02') {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,lVar5 - 1,
               (allocator_type *)local_c8);
    if ((long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memcpy(pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 1,
             (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    }
    ByteData::ByteData((ByteData *)&local_58,&pubkey);
    Pubkey::Pubkey(&pk,(ByteData *)&local_58);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
    Pubkey::GetData((ByteData *)local_c8,&pk);
    ByteData::GetBytes(&pk_bytes,(ByteData *)local_c8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    ::std::__cxx11::string::string((string *)local_c8,"output bip32 pubkey",(allocator *)&path);
    FindPsbtMap(&output->keypaths,&pk_bytes,(string *)local_c8,(size_t *)0x0);
    ::std::__cxx11::string::~string((string *)local_c8);
    uVar6 = (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar6 < 4) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x5a6;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<>((CfdSourceLocation *)local_c8,"psbt invalid value format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_c8,"psbt invalid value format error.",(allocator *)&path);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    uVar6 = uVar6 - 4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&path,uVar6 >> 2,
               (allocator_type *)local_c8);
    if (uVar6 != 0) {
      memcpy(path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 4,uVar6);
    }
    ret = wally_map_add_keypath_item
                    (&output->keypaths,
                     pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)pk_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)pk_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start,4,
                     path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
    if (ret != 0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x5b4;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<int&>((CfdSourceLocation *)local_c8,"wally_map_add_keypath_item NG[{}]",&ret);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_c8,"psbt set output pubkey error.",&local_a1);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else if (uVar1 == '\x01') {
    if (lVar5 != 1) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x58b;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<>((CfdSourceLocation *)local_c8,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_c8,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (output->witness_script != (uchar *)0x0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x590;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<>((CfdSourceLocation *)local_c8,"output witnessScript duplicates.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_c8,"psbt output witnessScript duplicates error.",
                 (allocator *)&pubkey);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    puVar2 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ret = wally_psbt_output_set_witness_script
                    (output,puVar2,
                     (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    if (ret != 0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x598;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<int&>((CfdSourceLocation *)local_c8,"wally_psbt_output_set_witness_script NG[{}]"
                         ,&ret);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_c8,"psbt set output witnessScript error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else if (uVar1 == '\0') {
    if (lVar5 != 1) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x578;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<>((CfdSourceLocation *)local_c8,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_c8,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (output->redeem_script != (uchar *)0x0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x57d;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<>((CfdSourceLocation *)local_c8,"output redeemScript duplicates.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_c8,"psbt output redeemScript duplicates error.",
                 (allocator *)&pubkey);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    puVar2 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ret = wally_psbt_output_set_redeem_script
                    (output,puVar2,
                     (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    if (ret != 0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x585;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<int&>((CfdSourceLocation *)local_c8,"wally_psbt_output_set_redeem_script NG[{}]",
                         &ret);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_c8,"psbt set output redeemScript error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    ::std::__cxx11::string::string((string *)local_c8,"output unknowns",(allocator *)&pubkey);
    FindPsbtMap(&output->unknowns,key,(string *)local_c8,(size_t *)0x0);
    ::std::__cxx11::string::~string((string *)local_c8);
    puVar2 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ret = wally_map_add(&output->unknowns,puVar2,
                        (long)(key->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2,puVar3,
                        (long)(value->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
    if (ret != 0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x5bd;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::warn<int&>((CfdSourceLocation *)local_c8,"wally_map_add NG[{}]",&ret);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_c8,"psbt add output unknowns error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return *(key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
}

Assistant:

static uint8_t SetPsbtOutput(
    const std::vector<uint8_t> &key, const std::vector<uint8_t> &value,
    struct wally_psbt_output *output) {
  int ret;
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtOutputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->redeem_script != nullptr) {
      warn(CFD_LOG_SOURCE, "output redeemScript duplicates.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt output redeemScript duplicates error.");
    }
    ret = wally_psbt_output_set_redeem_script(
        output, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_output_set_redeem_script NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output redeemScript error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->witness_script != nullptr) {
      warn(CFD_LOG_SOURCE, "output witnessScript duplicates.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt output witnessScript duplicates error.");
    }
    ret = wally_psbt_output_set_witness_script(
        output, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_output_set_witness_script NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output witnessScript error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    FindPsbtMap(&output->keypaths, pk_bytes, "output bip32 pubkey");

    if (value.size() < 4) {
      warn(CFD_LOG_SOURCE, "psbt invalid value format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid value format error.");
    }
    size_t path_len = value.size() - 4;
    std::vector<uint32_t> path(path_len / 4);
    if (path_len != 0) {
      // TODO(k-matsuzawa) need endian support.
      memcpy(path.data(), &value.data()[4], path_len);
    }
    ret = wally_map_add_keypath_item(
        &output->keypaths, pk_bytes.data(), pk_bytes.size(), value.data(), 4,
        path.data(), path.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add_keypath_item NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output pubkey error.");
    }
  } else {
    FindPsbtMap(&output->unknowns, key, "output unknowns");
    ret = wally_map_add(
        &output->unknowns, key.data(), key.size(), value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt add output unknowns error.");
    }
  }
  return key[0];
}